

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.hpp
# Opt level: O1

void __thiscall
trex::
hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
register_type<Circle>
          (hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,t_type_info<Circle> *ti)

{
  pointer *pptVar1;
  pointer ptVar2;
  size_t sVar3;
  char *__s2;
  size_t __n;
  int iVar4;
  long lVar5;
  type_info *ptVar6;
  iterator __position;
  pointer ptVar7;
  byte bVar8;
  type_info local_78;
  
  bVar8 = 0;
  local_78.super_type_info.destroy = (ti->super_type_info).destroy;
  local_78.super_type_info.default_construct_at = (ti->super_type_info).default_construct_at;
  local_78.super_type_info.alloc_and_construct = (ti->super_type_info).alloc_and_construct;
  local_78.super_type_info.size = (ti->super_type_info).size;
  local_78.super_type_info.alignment = (ti->super_type_info).alignment;
  local_78.super_type_info.name._M_len = (ti->super_type_info).name._M_len;
  local_78.super_type_info.name._M_str = (ti->super_type_info).name._M_str;
  local_78.as_base = as_base<Circle>;
  local_78.construct_at_a = construct_at_a<Circle>;
  local_78.alloc_and_construct_a = alloc_and_construct_a<Circle>;
  ptVar7 = (this->m_registered_types).
           super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar2 = (this->m_registered_types).
           super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar7 != ptVar2) {
    sVar3 = (ti->super_type_info).name._M_len;
    __s2 = (ti->super_type_info).name._M_str;
    do {
      __n = (ptVar7->super_type_info).name._M_len;
      if ((__n == sVar3) &&
         ((__n == 0 || (iVar4 = bcmp((ptVar7->super_type_info).name._M_str,__s2,__n), iVar4 == 0))))
      {
        ptVar6 = &local_78;
        for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
          (ptVar7->super_type_info).name._M_len = *(size_t *)ptVar6;
          ptVar6 = (type_info *)((long)ptVar6 + ((ulong)bVar8 * -2 + 1) * 8);
          ptVar7 = (pointer)((long)ptVar7 + (ulong)bVar8 * -0x10 + 8);
        }
        return;
      }
      ptVar7 = ptVar7 + 1;
    } while (ptVar7 != ptVar2);
  }
  __position._M_current =
       (this->m_registered_types).
       super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_registered_types).
      super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<trex::hierarchy<Shape,std::__cxx11::string>::type_info,std::allocator<trex::hierarchy<Shape,std::__cxx11::string>::type_info>>
    ::_M_realloc_insert<trex::hierarchy<Shape,std::__cxx11::string>::type_info>
              ((vector<trex::hierarchy<Shape,std::__cxx11::string>::type_info,std::allocator<trex::hierarchy<Shape,std::__cxx11::string>::type_info>>
                *)&this->m_registered_types,__position,&local_78);
  }
  else {
    ptVar6 = &local_78;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      ((__position._M_current)->super_type_info).name._M_len = *(size_t *)ptVar6;
      ptVar6 = (type_info *)((long)ptVar6 + ((ulong)bVar8 * -2 + 1) * 8);
      __position._M_current = __position._M_current + (ulong)bVar8 * -0x10 + 8;
    }
    pptVar1 = &(this->m_registered_types).
               super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pptVar1 = *pptVar1 + 1;
  }
  return;
}

Assistant:

void register_type(const t_type_info<T>& ti)
    {
        static_assert(std::is_base_of<Base, T>::value, "Not a base class");

        priv::lock_guard l(m_register_mutex);

        type_info new_type_info;
        static_cast<trex::type_info&>(new_type_info) = ti;
        new_type_info.as_base = as_base<T>;
        new_type_info.construct_at_a = construct_at_a<T>;
        new_type_info.alloc_and_construct_a = alloc_and_construct_a<T>;

        // here we don't simply add the to the list
        // to support plugins and hot reloading, we override existing types
        for (auto& t : m_registered_types)
        {
            if (t.name == ti.name)
            {
                t = std::move(new_type_info);
                return;
            }
        }

        // type was not found, so add
        m_registered_types.emplace_back(std::move(new_type_info));
    }